

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Response::set_content_provider
          (Response *this,string *content_type,ContentProviderWithoutLength *provider,
          ContentProviderResourceReleaser *resource_releaser)

{
  ContentProviderAdapter local_80;
  allocator local_49;
  string local_48;
  ContentProviderResourceReleaser *local_28;
  ContentProviderResourceReleaser *resource_releaser_local;
  ContentProviderWithoutLength *provider_local;
  string *content_type_local;
  Response *this_local;
  
  local_28 = resource_releaser;
  resource_releaser_local = (ContentProviderResourceReleaser *)provider;
  provider_local = (ContentProviderWithoutLength *)content_type;
  content_type_local = &this->version;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Content-Type",&local_49);
  set_header(this,&local_48,(string *)provider_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this->content_length_ = 0;
  detail::ContentProviderAdapter::ContentProviderAdapter(&local_80,provider);
  std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::operator=
            ((function<bool(unsigned_long,unsigned_long,httplib::DataSink&)> *)
             &this->content_provider_,&local_80);
  detail::ContentProviderAdapter::~ContentProviderAdapter(&local_80);
  std::function<void_(bool)>::operator=
            (&this->content_provider_resource_releaser_,resource_releaser);
  this->is_chunked_content_provider_ = false;
  return;
}

Assistant:

inline void Response::set_content_provider(
    const std::string &content_type, ContentProviderWithoutLength provider,
    ContentProviderResourceReleaser resource_releaser) {
  set_header("Content-Type", content_type);
  content_length_ = 0;
  content_provider_ = detail::ContentProviderAdapter(std::move(provider));
  content_provider_resource_releaser_ = resource_releaser;
  is_chunked_content_provider_ = false;
}